

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetA.c
# Opt level: O3

void fiat_id_tc26_gost_3410_2012_512_paramSetA_inv(uint64_t *output,uint64_t *t1)

{
  int iVar1;
  fe_t_conflict1 acc;
  fe_t_conflict1 t6;
  fe_t_conflict1 t96;
  fe_t_conflict1 t48;
  fe_t_conflict1 t3;
  fe_t_conflict1 t24;
  fe_t_conflict1 t200;
  fe_t_conflict1 t2;
  fe_t_conflict1 t12;
  fe_t_conflict1 t102;
  fe_t_conflict1 t502;
  fe_t_conflict1 t400;
  fe_t_conflict1 t198;
  uint64_t auStack_448 [10];
  uint64_t local_3f8 [10];
  uint64_t local_3a8 [10];
  uint64_t local_358 [10];
  uint64_t local_308 [10];
  uint64_t local_2b8 [10];
  uint64_t local_268 [10];
  uint64_t local_218 [10];
  uint64_t local_1c8 [10];
  uint64_t local_178 [10];
  uint64_t local_128 [10];
  uint64_t local_d8 [10];
  uint64_t local_88 [11];
  
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(auStack_448,t1);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(local_218,auStack_448,t1);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(auStack_448,local_218);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(local_308,auStack_448,t1);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(auStack_448,local_308);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(auStack_448,auStack_448);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(auStack_448,auStack_448);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(local_3f8,auStack_448,local_308);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(auStack_448,local_3f8);
  iVar1 = 5;
  do {
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(auStack_448,auStack_448);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(local_1c8,auStack_448,local_3f8);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(auStack_448,local_1c8);
  iVar1 = 0xb;
  do {
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(auStack_448,auStack_448);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(local_2b8,auStack_448,local_1c8);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(auStack_448,local_2b8);
  iVar1 = 0x17;
  do {
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(auStack_448,auStack_448);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(local_358,auStack_448,local_2b8);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(auStack_448,local_358);
  iVar1 = 0x2f;
  do {
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(auStack_448,auStack_448);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(local_3a8,auStack_448,local_358);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(auStack_448,local_3a8);
  iVar1 = 5;
  do {
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(auStack_448,auStack_448);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(local_178,auStack_448,local_3f8);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(auStack_448,local_178);
  iVar1 = 0x5f;
  do {
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(auStack_448,auStack_448);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(local_88,auStack_448,local_3a8);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(auStack_448,local_88);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(auStack_448,auStack_448);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(local_268,auStack_448,local_218);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(auStack_448,local_268);
  iVar1 = 199;
  do {
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(auStack_448,auStack_448);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(local_d8,auStack_448,local_268);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(auStack_448,local_d8);
  iVar1 = 0x65;
  do {
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(auStack_448,auStack_448);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(local_128,auStack_448,local_178);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(auStack_448,local_128);
  iVar1 = 3;
  do {
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(auStack_448,auStack_448);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(auStack_448,auStack_448,local_308);
  iVar1 = 4;
  do {
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(auStack_448,auStack_448);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(auStack_448,auStack_448,t1);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(auStack_448,auStack_448);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(auStack_448,auStack_448);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(output,auStack_448,t1);
  return;
}

Assistant:

static void fiat_id_tc26_gost_3410_2012_512_paramSetA_inv(fe_t output,
                                                          const fe_t t1) {
    int i;
    /* temporary variables */
    fe_t acc, t102, t12, t198, t2, t200, t24, t3, t400, t48, t502, t6, t96;

    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, t1);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(t2, acc, t1);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, t2);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(t3, acc, t1);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, t3);
    for (i = 0; i < 2; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(t6, acc, t3);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, t6);
    for (i = 0; i < 5; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(t12, acc, t6);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, t12);
    for (i = 0; i < 11; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(t24, acc, t12);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, t24);
    for (i = 0; i < 23; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(t48, acc, t24);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, t48);
    for (i = 0; i < 47; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(t96, acc, t48);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, t96);
    for (i = 0; i < 5; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(t102, acc, t6);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, t102);
    for (i = 0; i < 95; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(t198, acc, t96);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, t198);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(t200, acc, t2);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, t200);
    for (i = 0; i < 199; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(t400, acc, t200);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, t400);
    for (i = 0; i < 101; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(t502, acc, t102);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, t502);
    for (i = 0; i < 3; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(acc, acc, t3);
    for (i = 0; i < 4; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(acc, acc, t1);
    for (i = 0; i < 2; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(output, acc, t1);
}